

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

VariableLookupPtr __thiscall Lodtalk::LocalScope::lookSymbol(LocalScope *this,Oop symbol)

{
  iterator iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  VariableLookupPtr VVar3;
  Oop local_48;
  OopRef local_40;
  
  OopRef::OopRef(&local_40,&local_48);
  iVar1 = std::
          _Rb_tree<Lodtalk::OopRef,_std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>,_std::_Select1st<std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>_>,_std::less<Lodtalk::OopRef>,_std::allocator<std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>_>_>
          ::find((_Rb_tree<Lodtalk::OopRef,_std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>,_std::_Select1st<std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>_>,_std::less<Lodtalk::OopRef>,_std::allocator<std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>_>_>
                  *)((long)symbol.field_0 + 0x18),&local_40);
  OopRef::~OopRef(&local_40);
  if (iVar1._M_node == (_Base_ptr)((long)symbol.field_0 + 0x20)) {
    (this->super_EvaluationScope)._vptr_EvaluationScope = (_func_int **)0x0;
    (this->super_EvaluationScope).parentScope.
    super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::__shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2> *)
               (iVar1._M_node + 2));
    _Var2._M_pi = extraout_RDX_00;
  }
  VVar3.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  VVar3.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariableLookupPtr)
         VVar3.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariableLookupPtr LocalScope::lookSymbol(Oop symbol)
{
	auto it = variables.find(symbol);
	if(it != variables.end())
		return it->second;
	return VariableLookupPtr();
}